

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O1

void __thiscall
TEST_MockParameterTest_expectMultipleMultipleCallsWithParameters_Test::testBody
          (TEST_MockParameterTest_expectMultipleMultipleCallsWithParameters_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  long *plVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  SimpleString SStack_58;
  SimpleString local_48;
  SimpleString local_38;
  SimpleString local_28;
  SimpleString local_18;
  
  SimpleString::SimpleString(&local_38,"");
  pMVar2 = mock(&local_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_48,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[5])(pMVar2,2,&local_48);
  SimpleString::SimpleString(&SStack_58,"double");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x88))
                             (0x3ff0000000000000,(long *)CONCAT44(extraout_var,iVar1),&SStack_58);
  (**(code **)(*plVar3 + 0x48))(plVar3);
  SimpleString::~SimpleString(&SStack_58);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::SimpleString(&local_38,"");
  pMVar2 = mock(&local_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_48,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[5])(pMVar2,2,&local_48);
  SimpleString::SimpleString(&SStack_58,"double");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x88))
                             (0x3ff0000000000000,(long *)CONCAT44(extraout_var_00,iVar1),&SStack_58)
  ;
  (**(code **)(*plVar3 + 0x48))(plVar3);
  SimpleString::~SimpleString(&SStack_58);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::SimpleString(&local_38,"");
  pMVar2 = mock(&local_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_48,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_48);
  SimpleString::SimpleString(&SStack_58,"double");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar1) + 0x70))
                             (0x3ff0000000000000,(long *)CONCAT44(extraout_var_01,iVar1),&SStack_58)
  ;
  SimpleString::SimpleString(&local_18,"int");
  plVar3 = (long *)(**(code **)(*plVar3 + 0x40))(plVar3,&local_18,1);
  SimpleString::SimpleString(&local_28,"string");
  (**(code **)(*plVar3 + 0x78))(plVar3,&local_28,"string");
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::~SimpleString(&SStack_58);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::SimpleString(&local_38,"");
  pMVar2 = mock(&local_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_48,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_48);
  SimpleString::SimpleString(&SStack_58,"double");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_02,iVar1) + 0x70))
                             (0x3ff0000000000000,(long *)CONCAT44(extraout_var_02,iVar1),&SStack_58)
  ;
  SimpleString::SimpleString(&local_18,"int");
  plVar3 = (long *)(**(code **)(*plVar3 + 0x40))(plVar3,&local_18,1);
  SimpleString::SimpleString(&local_28,"string");
  (**(code **)(*plVar3 + 0x78))(plVar3,&local_28,"string");
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::~SimpleString(&SStack_58);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::SimpleString(&local_38,"");
  pMVar2 = mock(&local_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_48,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_48);
  SimpleString::SimpleString(&SStack_58,"double");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar1) + 0x70))
                             (0x3ff0000000000000,(long *)CONCAT44(extraout_var_03,iVar1),&SStack_58)
  ;
  SimpleString::SimpleString(&local_18,"int");
  plVar3 = (long *)(**(code **)(*plVar3 + 0x40))(plVar3,&local_18,1);
  SimpleString::SimpleString(&local_28,"string");
  (**(code **)(*plVar3 + 0x78))(plVar3,&local_28,"string");
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::~SimpleString(&SStack_58);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::SimpleString(&local_38,"");
  pMVar2 = mock(&local_38,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_48,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_48);
  SimpleString::SimpleString(&SStack_58,"double");
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar1) + 0x70))
                             (0x3ff0000000000000,(long *)CONCAT44(extraout_var_04,iVar1),&SStack_58)
  ;
  SimpleString::SimpleString(&local_18,"int");
  plVar3 = (long *)(**(code **)(*plVar3 + 0x40))(plVar3,&local_18,1);
  SimpleString::SimpleString(&local_28,"string");
  (**(code **)(*plVar3 + 0x78))(plVar3,&local_28,"string");
  SimpleString::~SimpleString(&local_28);
  SimpleString::~SimpleString(&local_18);
  SimpleString::~SimpleString(&SStack_58);
  SimpleString::~SimpleString(&local_48);
  SimpleString::~SimpleString(&local_38);
  SimpleString::SimpleString(&local_38,"");
  pMVar2 = mock(&local_38,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])(pMVar2);
  SimpleString::~SimpleString(&local_38);
  return;
}

Assistant:

TEST(MockParameterTest, expectMultipleMultipleCallsWithParameters)
{
    mock().expectNCalls(2, "boo").withParameter("double", 1.0).ignoreOtherParameters();
    mock().expectNCalls(2, "boo").withParameter("double", 1.0).ignoreOtherParameters();
    mock().actualCall("boo").withParameter("double", 1.0).withParameter("int", 1).withParameter("string", "string");
    mock().actualCall("boo").withParameter("double", 1.0).withParameter("int", 1).withParameter("string", "string");
    mock().actualCall("boo").withParameter("double", 1.0).withParameter("int", 1).withParameter("string", "string");
    mock().actualCall("boo").withParameter("double", 1.0).withParameter("int", 1).withParameter("string", "string");

    mock().checkExpectations();
}